

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imleInline.hpp
# Opt level: O1

ArrayXZ * __thiscall
IMLE<1,_1,_FastLinearExpert>::getMultiplePredictionsJacobian(IMLE<1,_1,_FastLinearExpert> *this)

{
  double dVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pMVar5;
  pointer pFVar6;
  pointer piVar7;
  double *pdVar8;
  double *pdVar9;
  double *pdVar10;
  double *pdVar11;
  double *pdVar12;
  pointer pMVar13;
  pointer pMVar14;
  pointer pMVar15;
  undefined8 *puVar16;
  long lVar17;
  long lVar18;
  long lVar19;
  Index col_1;
  long lVar20;
  double *pdVar21;
  Index col;
  long lVar22;
  long lVar23;
  long lVar24;
  double *pdVar25;
  PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_> PVar26;
  plain_array<double,_1,_0,_0> pVar27;
  Mat weightedKappa;
  void *local_60;
  long local_58;
  undefined8 local_48;
  long local_40;
  undefined8 local_38;
  
  if (this->hasPredJacobian == false) {
    pMVar5 = (this->predictionsJacobian).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->predictionsJacobian).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
      (this->predictionsJacobian).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar5;
    }
    pMVar5 = (this->predictionsVarJacobian).
             super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             .
             super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((this->predictionsVarJacobian).
        super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        .
        super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
        ._M_impl.super__Vector_impl_data._M_finish != pMVar5) {
      (this->predictionsVarJacobian).
      super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      .
      super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = pMVar5;
    }
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::resize(&this->predictionsJacobian,(long)this->nSolFound,&this->zeroXZ);
    std::
    vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
    ::resize(&this->predictionsVarJacobian,(long)this->nSolFound,&this->zeroXZ);
    lVar17 = (long)this->M;
    if ((lVar17 != 0) &&
       (SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x7fffffffffffffff)) / SEXT816(lVar17),0) < 1)) {
      puVar16 = (undefined8 *)__cxa_allocate_exception(8);
      *puVar16 = operator_delete;
      __cxa_throw(puVar16,&std::bad_alloc::typeinfo,std::bad_alloc::~bad_alloc);
    }
    Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::resize
              ((DenseStorage<double,__1,__1,__1,_0> *)&this->zeta,lVar17,1,lVar17);
    local_40 = (long)this->nSolFound;
    local_48 = 1;
    local_38 = 0;
    Eigen::PlainObjectBase<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
    PlainObjectBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>>>
              ((PlainObjectBase<Eigen::Matrix<double,_1,_1,0,_1,_1>> *)&local_60,
               (DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
                *)&local_48);
    iVar4 = this->M;
    lVar17 = (long)iVar4;
    if (0 < lVar17) {
      pFVar6 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar7 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar18 = 0;
      do {
        if (0 < local_58) {
          lVar22 = piVar7[lVar18] * local_58;
          dVar1 = pFVar6[lVar18].super_LinearExpert<1,_1>.p_z_T;
          lVar23 = 0;
          do {
            *(double *)((long)local_60 + lVar23 * 8 + lVar22 * 8) =
                 (double)pFVar6[lVar18].super_LinearExpert<1,_1>.kappa.
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
                 dVar1 + *(double *)((long)local_60 + lVar23 * 8 + lVar22 * 8);
            lVar23 = lVar23 + 1;
          } while (local_58 != lVar23);
        }
        lVar18 = lVar18 + 1;
      } while (lVar18 != lVar17);
    }
    if (0 < iVar4) {
      pFVar6 = (this->experts).
               super_vector<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               .
               super__Vector_base<FastLinearExpert<1,_1>,_Eigen::aligned_allocator_indirection<FastLinearExpert<1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      piVar7 = (this->sNearest).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar8 = (this->sumW).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
               .m_data;
      pdVar9 = (this->varPhiAuxj).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pdVar10 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar18 = (this->zeta).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pdVar11 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar22 = (this->fInvRj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pdVar12 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
                m_storage.m_data;
      lVar23 = (this->invRxj).super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>.
               m_storage.m_rows;
      pMVar5 = (this->predictionsJacobian).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar13 = (this->predictionsVarJacobian).
                super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                .
                super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar19 = 0;
      pdVar21 = pdVar10;
      do {
        lVar24 = (long)piVar7[lVar19];
        if (0 < lVar18) {
          dVar1 = pFVar6[lVar19].super_LinearExpert<1,_1>.p_z_T;
          dVar2 = pdVar8[lVar24];
          pdVar25 = (double *)((long)local_60 + local_58 * lVar24 * 8);
          dVar3 = pdVar9[lVar19];
          lVar20 = 0;
          do {
            pdVar21[lVar20] =
                 (((double)pFVar6[lVar19].super_LinearExpert<1,_1>.kappa.
                           super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage *
                   dVar2 + (double)pFVar6[lVar19].super_LinearExpert<1,_1>.dGamma.
                                   super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                                   m_storage * dVar1) - *pdVar25) / dVar3;
            lVar20 = lVar20 + 1;
            pdVar25 = pdVar25 + local_58;
          } while (lVar18 != lVar20);
        }
        lVar20 = lVar22 * lVar19;
        PVar26.m_storage.m_data.array[0] =
             (DenseStorage<double,_1,_1,_1,_0>)
             (pdVar11[lVar20] *
              (double)pFVar6[lVar19].super_LinearExpert<1,_1>.Lambda.
                      super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage +
             (double)pMVar5[lVar24].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                     m_storage);
        pMVar5[lVar24].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage =
             PVar26.m_storage.m_data.array[0];
        pMVar5[lVar24].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage =
             (DenseStorage<double,_1,_1,_1,_0>)
             ((double)PVar26.m_storage.m_data.array[0] -
             pdVar10[lVar18 * lVar19] * pdVar12[lVar23 * lVar19]);
        pMVar13[lVar24].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage =
             (DenseStorage<double,_1,_1,_1,_0>)
             (pdVar10[lVar18 * lVar19] * pdVar11[lVar20] +
             (double)pMVar13[lVar24].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                     m_storage);
        lVar19 = lVar19 + 1;
        pdVar21 = pdVar21 + lVar18;
      } while (lVar19 != lVar17);
    }
    iVar4 = this->nSolFound;
    if (0 < (long)iVar4) {
      pdVar8 = (this->sum_p_z).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
               m_storage.m_data;
      pMVar5 = (this->predictions).
               super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               .
               super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pMVar13 = (this->predictionsVarJacobian).
                super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                .
                super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar14 = (this->predictionsJacobian).
                super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                .
                super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pMVar15 = (this->predictionsVar).
                super_vector<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                .
                super__Vector_base<Eigen::Matrix<double,_1,_1,_0,_1,_1>,_Eigen::aligned_allocator_indirection<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      lVar17 = 0;
      do {
        dVar1 = pdVar8[lVar17];
        if ((dVar1 != 0.0) || (NAN(dVar1))) {
          PVar26.m_storage.m_data.array[0] =
               (DenseStorage<double,_1,_1,_1,_0>)
               ((double)pMVar5[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                        m_storage *
                (double)pMVar13[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>
                        .m_storage +
               (double)pMVar14[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                       m_storage);
          pMVar14[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage =
               PVar26.m_storage.m_data.array[0];
          pMVar14[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage =
               (DenseStorage<double,_1,_1,_1,_0>)
               ((double)PVar26.m_storage.m_data.array[0] *
               (double)pMVar15[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
                       m_storage);
          PVar26.m_storage.m_data.array[0] =
               pMVar15[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
               m_storage;
          pVar27.array[0] =
               (double  [1])
               ((double)PVar26.m_storage.m_data.array[0] * (double)PVar26.m_storage.m_data.array[0]
               * (double)pMVar13[lVar17].
                         super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage);
        }
        else {
          pMVar14[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage =
               (DenseStorage<double,_1,_1,_1,_0>)
               (this->zeroXZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage
               .m_data.array[0];
          pVar27.array[0] =
               (double  [1])
               (this->infinityXZ).super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.
               m_storage.m_data.array[0];
        }
        pMVar13[lVar17].super_PlainObjectBase<Eigen::Matrix<double,_1,_1,_0,_1,_1>_>.m_storage =
             (DenseStorage<double,_1,_1,_1,_0>)pVar27.array[0];
        lVar17 = lVar17 + 1;
      } while (iVar4 != lVar17);
    }
    this->hasPredJacobian = true;
    free(local_60);
  }
  return &this->predictionsJacobian;
}

Assistant:

IMLE_CLASS_TEMPLATE
IMLE_TYPENAME IMLE_base::ArrayXZ const &IMLE_base::getMultiplePredictionsJacobian()
{
    if( !hasPredJacobian )
    {
        predictionsJacobian.clear();
        predictionsVarJacobian.clear();
        predictionsJacobian.resize(nSolFound, zeroXZ);
        predictionsVarJacobian.resize(nSolFound, zeroXZ);
        zeta.resize(d,M);

        Mat weightedKappa = Mat::Zero(d,nSolFound);
        for( int j = 0; j < M; j++ )
            weightedKappa.col(sNearest[j]) += experts[j].get_p_z() * experts[j].getKappa();

        for( int j = 0; j < M; j++ )
        {
            zeta.col(j) = (experts[j].get_p_z() * experts[j].get_dGamma() + sumW(sNearest[j]) * experts[j].getKappa() - weightedKappa.col(sNearest[j])) / varPhiAuxj(j);

            predictionsJacobian[sNearest[j]].noalias() += fInvRj.col(j).asDiagonal() * experts[j].Lambda - invRxj.col(j) * zeta.col(j).transpose();
            predictionsVarJacobian[sNearest[j]].noalias() += fInvRj.col(j) * zeta.col(j).transpose();
        }

        for( int k = 0; k < nSolFound; k++ )
            if(sum_p_z(k) == 0.0)  // Not likely, but...
            {
                predictionsJacobian[k] = zeroXZ;
                predictionsVarJacobian[k] = infinityXZ;
            }
            else
            {
                predictionsJacobian[k].noalias() += predictions[k].asDiagonal() * predictionsVarJacobian[k];
                predictionsJacobian[k] = predictionsVar[k].asDiagonal() * predictionsJacobian[k];
                predictionsVarJacobian[k] = predictionsVar[k].cwiseAbs2().asDiagonal() * predictionsVarJacobian[k];
            }

        hasPredJacobian = true;
    }

    return predictionsJacobian;
}